

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.c
# Opt level: O0

Class * newRawClass(VM *vm,char *name,uint32_t fieldNum)

{
  Class *objHeader;
  size_t sVar1;
  ObjString *pOVar2;
  Class *class;
  uint32_t fieldNum_local;
  char *name_local;
  VM *vm_local;
  
  objHeader = (Class *)memManager(vm,(void *)0x0,0,0x40);
  initObjHeader(vm,(ObjHeader *)objHeader,OT_CLASS,(Class *)0x0);
  sVar1 = strlen(name);
  pOVar2 = newObjString(vm,name,(uint32_t)sVar1);
  objHeader->name = pOVar2;
  objHeader->fieldNum = fieldNum;
  objHeader->superClass = (class *)0x0;
  MethodBufferInit(&objHeader->methods);
  return objHeader;
}

Assistant:

Class *newRawClass(VM *vm, const char *name, uint32_t fieldNum) {
    Class *class = ALLOCATE(vm, Class);
    initObjHeader(vm, &class->objHeader, OT_CLASS, NULL);
    class->name = newObjString(vm, name, strlen(name));
    class->fieldNum = fieldNum;
    class->superClass = NULL;
    MethodBufferInit(&class->methods);

    return class;
}